

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O1

X509CertificateExtension *
QTlsPrivate::X509CertificateOpenSSL::convertExtension
          (X509CertificateExtension *__return_storage_ptr__,X509_EXTENSION *ext)

{
  char *pcVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int *piVar5;
  Data *pDVar6;
  undefined1 *puVar7;
  Data *pDVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  ASN1_OBJECT *pAVar12;
  X509V3_EXT_METHOD *pXVar13;
  BASIC_CONSTRAINTS *a;
  QVariant *pQVar14;
  long lVar15;
  OPENSSL_STACK *a_00;
  undefined8 *puVar16;
  QLoggingCategory *pQVar17;
  AUTHORITY_KEYID *a_01;
  ASN1_ITEM *pAVar18;
  ASN1_VALUE *pAVar19;
  stack_st_CONF_VALUE *a_02;
  void *pvVar20;
  storage_type *psVar21;
  ASN1_OCTET_STRING *a_03;
  uchar *puVar22;
  char *pcVar23;
  BIO_METHOD *a_04;
  BIO *a_05;
  X509CertificateOpenSSL *pXVar24;
  bool bVar25;
  storage_type *psVar26;
  int iVar27;
  QMap *this;
  long in_FS_OFFSET;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  char *bio_buffer;
  char buf [80];
  QString local_128;
  QMap<QString,_QVariant> local_108;
  QString local_100;
  QString local_e8;
  QArrayDataPointer<QVariant> local_c8;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  undefined1 *puStack_90;
  anon_union_24_3_e3d07ef4_for_data local_88;
  char *pcStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)((long)&(__return_storage_ptr__->value).d.data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->value).d.field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->critical = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->oid).d.d = (Data *)0x0;
  (__return_storage_ptr__->oid).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->oid).d.size = 0;
  (__return_storage_ptr__->name).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->name).d.size = 0;
  (__return_storage_ptr__->value).d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).d.data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).d.data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->value).d.field_0x18 = 2;
  __return_storage_ptr__->critical = false;
  __return_storage_ptr__->supported = false;
  pAVar12 = q_X509_EXTENSION_get_object(ext);
  if (pAVar12 == (ASN1_OBJECT *)0x0) goto LAB_0011fbfa;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_88._16_4_ = 0;
  local_88._20_4_ = 0;
  pcStack_70 = (char *)0x0;
  local_88._0_4_ = 0;
  local_88._4_4_ = 0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  q_OBJ_obj2txt((char *)local_88.data,0x50,pAVar12,1);
  QByteArray::QByteArray((QByteArray *)&local_a8,(char *)local_88.data,-1);
  QVar28.m_data = (storage_type *)local_a8._16_8_;
  QVar28.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar28);
  pQVar2 = &((__return_storage_ptr__->oid).d.d)->super_QArrayData;
  pcVar3 = (__return_storage_ptr__->oid).d.ptr;
  pDVar6 = (Data *)CONCAT44(local_88._4_4_,local_88._0_4_);
  local_88._0_4_ = SUB84(pQVar2,0);
  local_88._4_4_ = (undefined4)((ulong)pQVar2 >> 0x20);
  (__return_storage_ptr__->oid).d.d = pDVar6;
  (__return_storage_ptr__->oid).d.ptr = (char16_t *)CONCAT44(local_88._12_4_,local_88._8_4_);
  local_88._8_4_ = SUB84(pcVar3,0);
  local_88._12_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
  qVar4 = (__return_storage_ptr__->oid).d.size;
  (__return_storage_ptr__->oid).d.size = CONCAT44(local_88._20_4_,local_88._16_4_);
  local_88._16_4_ = (undefined4)qVar4;
  local_88._20_4_ = (undefined4)((ulong)qVar4 >> 0x20);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if ((QArrayData *)local_a8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
    UNLOCK();
    if (*(int *)local_a8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_a8.shared,1,0x10);
    }
  }
  anon_unknown_2::asn1ObjectName((QByteArray *)&local_a8,pAVar12);
  QVar29.m_data = (storage_type *)local_a8._16_8_;
  QVar29.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar29);
  pQVar2 = &((__return_storage_ptr__->name).d.d)->super_QArrayData;
  pcVar3 = (__return_storage_ptr__->name).d.ptr;
  pDVar6 = (Data *)CONCAT44(local_88._4_4_,local_88._0_4_);
  local_88._0_4_ = SUB84(pQVar2,0);
  local_88._4_4_ = (undefined4)((ulong)pQVar2 >> 0x20);
  (__return_storage_ptr__->name).d.d = pDVar6;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)CONCAT44(local_88._12_4_,local_88._8_4_);
  local_88._8_4_ = SUB84(pcVar3,0);
  local_88._12_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
  qVar4 = (__return_storage_ptr__->name).d.size;
  (__return_storage_ptr__->name).d.size = CONCAT44(local_88._20_4_,local_88._16_4_);
  local_88._16_4_ = (undefined4)qVar4;
  local_88._20_4_ = (undefined4)((ulong)qVar4 >> 0x20);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if ((QArrayData *)local_a8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
    UNLOCK();
    if (*(int *)local_a8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_a8.shared,1,0x10);
    }
  }
  iVar10 = q_X509_EXTENSION_get_critical(ext);
  __return_storage_ptr__->critical = iVar10 != 0;
  local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pAVar12 = q_X509_EXTENSION_get_object(ext);
  iVar10 = q_OBJ_obj2nid(pAVar12);
  pXVar13 = q_X509V3_EXT_get(ext);
  if (iVar10 < 0x5a) {
    if (iVar10 != 0x52) {
      if ((iVar10 != 0x57) ||
         (a = (BASIC_CONSTRAINTS *)q_X509V3_EXT_d2i(ext), a == (BASIC_CONSTRAINTS *)0x0))
      goto LAB_0011f4b7;
      local_100.d.d = (Data *)0x0;
      QVariant::QVariant((QVariant *)&local_88,a->ca != 0);
      QVar30.m_data = (storage_type *)0x2;
      QVar30.m_size = (qsizetype)&local_c8;
      QString::fromLatin1(QVar30);
      local_e8.d.d = (Data *)local_c8.d;
      local_e8.d.ptr = (char16_t *)local_c8.ptr;
      local_e8.d.size = local_c8.size;
      pQVar14 = QMap<QString,_QVariant>::operator[]((QMap<QString,_QVariant> *)&local_100,&local_e8)
      ;
      QVariant::operator=(pQVar14,(QVariant *)&local_88);
      if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QVariant::~QVariant((QVariant *)&local_88);
      if (a->pathlen != (ASN1_INTEGER *)0x0) {
        lVar15 = q_ASN1_INTEGER_get(a->pathlen);
        QVariant::QVariant((QVariant *)&local_88,lVar15);
        QVar31.m_data = (storage_type *)0x11;
        QVar31.m_size = (qsizetype)&local_c8;
        QString::fromLatin1(QVar31);
        local_e8.d.d = (Data *)local_c8.d;
        local_e8.d.ptr = (char16_t *)local_c8.ptr;
        local_e8.d.size = local_c8.size;
        pQVar14 = QMap<QString,_QVariant>::operator[]
                            ((QMap<QString,_QVariant> *)&local_100,&local_e8);
        QVariant::operator=(pQVar14,(QVariant *)&local_88);
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
          }
        }
        QVariant::~QVariant((QVariant *)&local_88);
      }
      q_BASIC_CONSTRAINTS_free(a);
      this = (QMap *)&local_100;
LAB_0011f4a5:
      QVariant::QVariant((QVariant *)&local_a8,this);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)this);
      goto LAB_0011f4da;
    }
    pAVar19 = (ASN1_VALUE *)q_X509V3_EXT_d2i(ext);
    if (pAVar19 == (ASN1_VALUE *)0x0) {
      local_a8.shared = (PrivateShared *)0x0;
      local_a8._8_8_ = (undefined1 *)0x0;
      local_a8._16_8_ = (storage_type *)0x0;
      puStack_90 = (undefined1 *)0x2;
      pcVar23 = (char *)0x0;
    }
    else {
      pcVar23 = (*pXVar13->i2s)(pXVar13,pAVar19);
      if (pcVar23 == (char *)0x0) {
        psVar26 = (storage_type *)0x0;
      }
      else {
        psVar21 = (storage_type *)0xffffffffffffffff;
        do {
          psVar26 = psVar21 + 1;
          pcVar1 = pcVar23 + 1 + (long)psVar21;
          psVar21 = psVar26;
        } while (*pcVar1 != '\0');
      }
      QVar41.m_data = psVar26;
      QVar41.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar41);
      QVariant::QVariant((QVariant *)&local_a8,(QString *)&local_88);
      piVar5 = (int *)CONCAT44(local_88._4_4_,local_88._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_88._4_4_,local_88._0_4_),2,0x10);
        }
      }
    }
  }
  else {
    if (iVar10 == 0x5a) {
      a_01 = (AUTHORITY_KEYID *)q_X509V3_EXT_d2i(ext);
      if (a_01 != (AUTHORITY_KEYID *)0x0) {
        local_108.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
                )0x0;
        if (a_01->keyid != (ASN1_OCTET_STRING *)0x0) {
          local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray
                    ((QByteArray *)&local_e8,(char *)a_01->keyid->data,(long)a_01->keyid->length);
          QByteArray::toHex('\0');
          QVariant::QVariant((QVariant *)&local_88,(QByteArray *)&local_100);
          QVar35.m_data = (storage_type *)0x5;
          QVar35.m_size = (qsizetype)&local_c8;
          QString::fromLatin1(QVar35);
          local_128.d.d = (Data *)local_c8.d;
          local_128.d.ptr = (char16_t *)local_c8.ptr;
          local_128.d.size = local_c8.size;
          pQVar14 = QMap<QString,_QVariant>::operator[](&local_108,&local_128);
          QVariant::operator=(pQVar14,(QVariant *)&local_88);
          if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
            }
          }
          QVariant::~QVariant((QVariant *)&local_88);
          if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        if (a_01->serial != (ASN1_INTEGER *)0x0) {
          lVar15 = q_ASN1_INTEGER_get(a_01->serial);
          QVariant::QVariant((QVariant *)&local_88,lVar15);
          QVar36.m_data = (storage_type *)0x6;
          QVar36.m_size = (qsizetype)&local_c8;
          QString::fromLatin1(QVar36);
          local_e8.d.d = (Data *)local_c8.d;
          local_e8.d.ptr = (char16_t *)local_c8.ptr;
          local_e8.d.size = local_c8.size;
          pQVar14 = QMap<QString,_QVariant>::operator[](&local_108,&local_e8);
          QVariant::operator=(pQVar14,(QVariant *)&local_88);
          if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
            }
          }
          QVariant::~QVariant((QVariant *)&local_88);
        }
        q_AUTHORITY_KEYID_free(a_01);
        this = (QMap *)&local_108;
        goto LAB_0011f4a5;
      }
    }
    else if ((iVar10 == 0xb1) &&
            (a_00 = (OPENSSL_STACK *)q_X509V3_EXT_d2i(ext), a_00 != (OPENSSL_STACK *)0x0)) {
      local_128.d.d = (Data *)0x0;
      iVar10 = q_OPENSSL_sk_num(a_00);
      if (0 < iVar10) {
        iVar10 = 0;
        do {
          puVar16 = (undefined8 *)q_OPENSSL_sk_value(a_00,iVar10);
          piVar5 = (int *)puVar16[1];
          if (*piVar5 == 6) {
            uVar11 = q_ASN1_STRING_length(*(ASN1_STRING **)(piVar5 + 2));
            if (uVar11 < 0x2000) {
              puVar22 = q_ASN1_STRING_get0_data(*(ASN1_STRING **)(piVar5 + 2));
              psVar26 = (storage_type *)(ulong)uVar11;
              if (puVar22 == (uchar *)0x0) {
                psVar26 = (storage_type *)0x0;
              }
              local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
              QVar32.m_data = psVar26;
              QVar32.m_size = (qsizetype)&local_c8;
              QString::fromUtf8(QVar32);
              QVariant::QVariant((QVariant *)&local_88,(QString *)&local_c8);
              anon_unknown_2::asn1ObjectName((QByteArray *)&local_100,(ASN1_OBJECT *)*puVar16);
              QVar33.m_data = (storage_type *)local_100.d.size;
              QVar33.m_size = (qsizetype)&local_e8;
              QString::fromUtf8(QVar33);
              pQVar14 = QMap<QString,_QVariant>::operator[]
                                  ((QMap<QString,_QVariant> *)&local_128,&local_e8);
              QVariant::operator=(pQVar14,(QVariant *)&local_88);
              if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,1,0x10);
                }
              }
              QVariant::~QVariant((QVariant *)&local_88);
              if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
          else {
            pQVar17 = lcTlsBackend();
            if (((pQVar17->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
              pcStack_70 = pQVar17->name;
              local_88._0_4_ = 2;
              local_88._4_4_ = 0;
              local_88._8_4_ = 0;
              local_88._12_4_ = 0;
              local_88._16_4_ = 0;
              local_88._20_4_ = 0;
              QMessageLogger::warning();
              pDVar6 = local_e8.d.d;
              QVar34.m_data = (storage_type *)0x15;
              QVar34.m_size = (qsizetype)&local_c8;
              QString::fromUtf8(QVar34);
              QTextStream::operator<<((QTextStream *)pDVar6,(QString *)&local_c8);
              if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
                }
              }
              if ((char)local_e8.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i
                  == '\x01') {
                QTextStream::operator<<((QTextStream *)local_e8.d.d,' ');
              }
              QTextStream::operator<<((QTextStream *)local_e8.d.d,*piVar5);
              if ((char)local_e8.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i
                  == '\x01') {
                QTextStream::operator<<((QTextStream *)local_e8.d.d,' ');
              }
              QDebug::~QDebug((QDebug *)&local_e8);
            }
          }
          iVar10 = iVar10 + 1;
          iVar27 = q_OPENSSL_sk_num(a_00);
        } while (iVar10 < iVar27);
      }
      q_AUTHORITY_INFO_ACCESS_free((AUTHORITY_INFO_ACCESS *)a_00);
      QVariant::QVariant((QVariant *)&local_a8,(QMap *)&local_128);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)&local_128);
      pcVar23 = (char *)0x0;
      pAVar19 = (ASN1_VALUE *)0x0;
      goto LAB_0011f4e0;
    }
LAB_0011f4b7:
    local_a8.shared = (PrivateShared *)0x0;
    local_a8._8_8_ = (undefined1 *)0x0;
    local_a8._16_8_ = (storage_type *)0x0;
    puStack_90 = (undefined1 *)0x2;
LAB_0011f4da:
    pcVar23 = (char *)0x0;
    pAVar19 = (ASN1_VALUE *)0x0;
  }
LAB_0011f4e0:
  if (pcVar23 != (char *)0x0) {
    q_CRYPTO_free(pcVar23,"",0);
  }
  if (pAVar19 != (ASN1_VALUE *)0x0 && pXVar13 != (X509V3_EXT_METHOD *)0x0) {
    if (pXVar13->it == (ASN1_ITEM_EXP *)0x0) {
      if (pXVar13->ext_free == (X509V3_EXT_FREE)0x0) {
        pXVar24 = (X509CertificateOpenSSL *)lcTlsBackend();
        if (((ulong)(pXVar24->super_X509CertificateBase).versionString.d.d & 0x100) != 0) {
          convertExtension(pXVar24);
        }
      }
      else {
        (*pXVar13->ext_free)(pAVar19);
      }
    }
    else {
      pAVar18 = (*pXVar13->it)();
      q_ASN1_item_free(pAVar19,pAVar18);
    }
  }
  bVar9 = true;
  if (puStack_90 < (undefined1 *)0x4) {
    pXVar13 = q_X509V3_EXT_get(ext);
    if (pXVar13 == (X509V3_EXT_METHOD *)0x0) {
      a_03 = q_X509_EXTENSION_get_data(ext);
      local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      puVar22 = q_ASN1_STRING_get0_data(a_03);
      iVar10 = q_ASN1_STRING_length(a_03);
      QByteArray::QByteArray((QByteArray *)&local_c8,(char *)puVar22,(long)iVar10);
      QVariant::QVariant((QVariant *)&local_88,(QByteArray *)&local_c8);
      if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.d)->super_QArrayData,1,0x10);
        }
      }
    }
    else {
      pAVar19 = (ASN1_VALUE *)q_X509V3_EXT_d2i(ext);
      if (pAVar19 == (ASN1_VALUE *)0x0) {
        local_88._0_4_ = 0;
        local_88._4_4_ = 0;
        local_88._8_4_ = 0;
        local_88._12_4_ = 0;
        local_88._16_4_ = 0;
        local_88._20_4_ = 0;
        pcStack_70 = (char *)0x2;
      }
      else {
        if (pXVar13->i2v == (X509V3_EXT_I2V)0x0) {
          if (pXVar13->i2s == (X509V3_EXT_I2S)0x0) {
            if (pXVar13->i2r == (X509V3_EXT_I2R)0x0) {
              local_88._0_4_ = 0;
              local_88._4_4_ = 0;
              local_88._8_4_ = 0;
              local_88._12_4_ = 0;
              local_88._16_4_ = 0;
              local_88._20_4_ = 0;
              pcStack_70 = (char *)0x2;
            }
            else {
              local_c8.d = (Data *)0x0;
              local_c8.ptr = (QVariant *)0x0;
              local_c8.size = 0;
              a_04 = q_BIO_s_mem();
              a_05 = q_BIO_new(a_04);
              if (a_05 != (BIO *)0x0) {
                (*pXVar13->i2r)(pXVar13,pAVar19,a_05,0);
                local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                lVar15 = q_BIO_ctrl(a_05,3,0,&local_e8);
                QByteArray::QByteArray
                          ((QByteArray *)&local_88,(char *)local_e8.d.d,(long)(int)lVar15);
                pDVar8 = local_c8.d;
                pQVar2 = (QArrayData *)CONCAT44(local_88._4_4_,local_88._0_4_);
                pQVar14 = (QVariant *)CONCAT44(local_88._12_4_,local_88._8_4_);
                local_88._0_4_ = SUB84(local_c8.d,0);
                local_88._4_4_ = (undefined4)((ulong)local_c8.d >> 0x20);
                puVar7 = (undefined1 *)CONCAT44(local_88._20_4_,local_88._16_4_);
                local_88._8_4_ = SUB84(local_c8.ptr,0);
                local_88._12_4_ = (undefined4)((ulong)local_c8.ptr >> 0x20);
                local_88._16_4_ = (undefined4)local_c8.size;
                local_88._20_4_ = (undefined4)((ulong)local_c8.size >> 0x20);
                local_c8.ptr = pQVar14;
                local_c8.size = (qsizetype)puVar7;
                if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    local_c8.d = (Data *)pQVar2;
                    QArrayData::deallocate(&pDVar8->super_QArrayData,1,0x10);
                    pQVar2 = &(local_c8.d)->super_QArrayData;
                  }
                }
                local_c8.d = (Data *)pQVar2;
                q_BIO_free(a_05);
              }
              QVariant::QVariant((QVariant *)&local_88,(QByteArray *)&local_c8);
              if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_c8.d)->super_QArrayData,1,0x10);
                }
              }
            }
          }
          else {
            pcVar23 = (*pXVar13->i2s)(pXVar13,pAVar19);
            local_88._0_4_ = 0xaaaaaaaa;
            local_88._4_4_ = 0xaaaaaaaa;
            local_88._8_4_ = 0xaaaaaaaa;
            local_88._12_4_ = 0xaaaaaaaa;
            local_88._16_4_ = 0xaaaaaaaa;
            local_88._20_4_ = 0xaaaaaaaa;
            pcStack_70 = &DAT_aaaaaaaaaaaaaaaa;
            if (pcVar23 == (char *)0x0) {
              local_c8.d = (Data *)0x0;
              local_c8.ptr = (QVariant *)0x0;
              local_c8.size = 0;
            }
            else {
              psVar26 = (storage_type *)0xffffffffffffffff;
              do {
                pcVar1 = pcVar23 + 1 + (long)psVar26;
                psVar26 = psVar26 + 1;
              } while (*pcVar1 != '\0');
              QVar40.m_data = psVar26;
              QVar40.m_size = (qsizetype)&local_c8;
              QString::fromUtf8(QVar40);
            }
            QVariant::QVariant((QVariant *)&local_88,(QString *)&local_c8);
            if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
              }
            }
            q_CRYPTO_free(pcVar23,"",0);
          }
        }
        else {
          iVar27 = 0;
          a_02 = (*pXVar13->i2v)(pXVar13,pAVar19,(stack_st_CONF_VALUE *)0x0);
          local_128.d.d = (Data *)0x0;
          local_c8.d = (Data *)0x0;
          local_c8.ptr = (QVariant *)0x0;
          local_c8.size = 0;
          iVar10 = q_OPENSSL_sk_num((OPENSSL_STACK *)a_02);
          if (iVar10 < 1) {
LAB_0011f8ee:
            QVariant::QVariant((QVariant *)&local_88,(QList *)&local_c8);
          }
          else {
            bVar9 = false;
            do {
              pvVar20 = q_OPENSSL_sk_value((OPENSSL_STACK *)a_02,iVar27);
              if (*(long *)((long)pvVar20 + 8) == 0) {
                if (*(long *)((long)pvVar20 + 0x10) != 0) {
                  if (*(long *)((long)pvVar20 + 0x10) == 0) goto LAB_0011f6e3;
                  psVar26 = (storage_type *)0xffffffffffffffff;
                  do {
                    psVar21 = psVar26 + 1;
                    pcVar23 = psVar26 + *(long *)((long)pvVar20 + 0x10) + 1;
                    psVar26 = psVar21;
                  } while (*pcVar23 != '\0');
                  goto LAB_0011f6e5;
                }
              }
              else if (*(long *)((long)pvVar20 + 0x10) == 0) {
                if (*(long *)((long)pvVar20 + 8) == 0) {
LAB_0011f6e3:
                  psVar21 = (storage_type *)0x0;
                }
                else {
                  psVar26 = (storage_type *)0xffffffffffffffff;
                  do {
                    psVar21 = psVar26 + 1;
                    pcVar23 = psVar26 + *(long *)((long)pvVar20 + 8) + 1;
                    psVar26 = psVar21;
                  } while (*pcVar23 != '\0');
                }
LAB_0011f6e5:
                QVar37.m_data = psVar21;
                QVar37.m_size = (qsizetype)&local_e8;
                QString::fromUtf8(QVar37);
                QVariant::QVariant((QVariant *)&local_88,&local_e8);
                QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                          ((QMovableArrayOps<QVariant> *)&local_c8,local_c8.size,
                           (QVariant *)&local_88);
                QList<QVariant>::end((QList<QVariant> *)&local_c8);
                QVariant::~QVariant((QVariant *)&local_88);
                if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              else {
                if (*(long *)((long)pvVar20 + 0x10) == 0) {
                  psVar26 = (storage_type *)0x0;
                }
                else {
                  psVar21 = (storage_type *)0xffffffffffffffff;
                  do {
                    psVar26 = psVar21 + 1;
                    pcVar23 = psVar21 + *(long *)((long)pvVar20 + 0x10) + 1;
                    psVar21 = psVar26;
                  } while (*pcVar23 != '\0');
                }
                QVar38.m_data = psVar26;
                QVar38.m_size = (qsizetype)&local_e8;
                QString::fromUtf8(QVar38);
                QVariant::QVariant((QVariant *)&local_88,&local_e8);
                if (*(long *)((long)pvVar20 + 8) == 0) {
                  psVar26 = (storage_type *)0x0;
                }
                else {
                  psVar21 = (storage_type *)0xffffffffffffffff;
                  do {
                    psVar26 = psVar21 + 1;
                    pcVar23 = psVar21 + *(long *)((long)pvVar20 + 8) + 1;
                    psVar21 = psVar26;
                  } while (*pcVar23 != '\0');
                }
                QVar39.m_data = psVar26;
                QVar39.m_size = (qsizetype)&local_100;
                QString::fromUtf8(QVar39);
                pQVar14 = QMap<QString,_QVariant>::operator[]
                                    ((QMap<QString,_QVariant> *)&local_128,&local_100);
                QVariant::operator=(pQVar14,(QVariant *)&local_88);
                if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QVariant::~QVariant((QVariant *)&local_88);
                if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                bVar9 = true;
              }
              iVar27 = iVar27 + 1;
              iVar10 = q_OPENSSL_sk_num((OPENSSL_STACK *)a_02);
            } while (iVar27 < iVar10);
            if (!bVar9) goto LAB_0011f8ee;
            QVariant::QVariant((QVariant *)&local_88,(QMap *)&local_128);
          }
          QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_c8);
          QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          ::~QExplicitlySharedDataPointerV2
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                      *)&local_128);
          if (a_02 != (stack_st_CONF_VALUE *)0x0) {
            q_OPENSSL_sk_pop_free((OPENSSL_STACK *)a_02,q_X509V3_conf_free);
          }
        }
        if (pXVar13->it == (ASN1_ITEM_EXP *)0x0) {
          if (pXVar13->ext_free == (X509V3_EXT_FREE)0x0) {
            pXVar24 = (X509CertificateOpenSSL *)lcTlsBackend();
            if (((ulong)(pXVar24->super_X509CertificateBase).versionString.d.d & 0x100) != 0) {
              convertExtension(pXVar24);
            }
          }
          else {
            (*pXVar13->ext_free)(pAVar19);
          }
        }
        else {
          pAVar18 = (*pXVar13->it)();
          q_ASN1_item_free(pAVar19,pAVar18);
        }
      }
    }
    QVariant::operator=((QVariant *)&local_a8,(QVariant *)&local_88);
    QVariant::~QVariant((QVariant *)&local_88);
    bVar25 = false;
    bVar9 = false;
    if ((undefined1 *)0x3 < puStack_90) goto LAB_0011fbd8;
  }
  else {
LAB_0011fbd8:
    bVar25 = bVar9;
    QVariant::operator=(&__return_storage_ptr__->value,(QVariant *)&local_a8);
  }
  __return_storage_ptr__->supported = bVar25;
  QVariant::~QVariant((QVariant *)&local_a8);
LAB_0011fbfa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

X509CertificateBase::X509CertificateExtension X509CertificateOpenSSL::convertExtension(X509_EXTENSION *ext)
{
    Q_ASSERT(ext);

    X509CertificateExtension result;

    ASN1_OBJECT *obj = q_X509_EXTENSION_get_object(ext);
    if (!obj)
        return result;

    result.oid = QString::fromUtf8(asn1ObjectId(obj));
    result.name = QString::fromUtf8(asn1ObjectName(obj));

    result.critical = bool(q_X509_EXTENSION_get_critical(ext));

    // Lets see if we have custom support for this one
    QVariant extensionValue = x509ExtensionToValue(ext);
    if (extensionValue.isValid()) {
        result.value = extensionValue;
        result.supported = true;
        return result;
    }

    extensionValue = x509UnknownExtensionToValue(ext);
    if (extensionValue.isValid())
        result.value = extensionValue;

    result.supported = false;

    return result;
}